

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void biftrc(bifcxdef *ctx,int argc)

{
  uchar *puVar1;
  runsdef *prVar2;
  int iVar3;
  runcxdef *prVar4;
  runsdef val;
  runsdef rStack_18;
  
  prVar4 = ctx->bifcxrun;
  if (argc == 2) {
    prVar2 = prVar4->runcxsp;
    prVar4->runcxsp = prVar2 + -1;
    prVar4 = ctx->bifcxrun;
    if (prVar2[-1].runstyp != '\x01') {
      prVar4->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    prVar2 = prVar4->runcxsp;
    iVar3 = *(int *)&prVar2->runsv;
    prVar4->runcxsp = prVar2 + -1;
    if (prVar2[-1].runstyp == '\b') {
      prVar4 = ctx->bifcxrun;
      if (iVar3 != 1) {
LAB_0012376a:
        prVar4->runcxerr->errcxptr->erraav[0].errastr = "debugTrace";
        ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
        runsign(ctx->bifcxrun,0x400);
      }
      puVar1 = &prVar4->runcxvoc->voccxflg;
      *puVar1 = *puVar1 | 4;
    }
    else {
      prVar4 = ctx->bifcxrun;
      if (prVar4->runcxsp->runstyp != '\x05') {
        prVar4->runcxerr->errcxptr->erraac = 0;
        runsign(ctx->bifcxrun,0x3ed);
      }
      if (iVar3 != 1) goto LAB_0012376a;
      puVar1 = &prVar4->runcxvoc->voccxflg;
      *puVar1 = *puVar1 & 0xfb;
    }
  }
  else {
    iVar3 = dbgstart(prVar4->runcxdbg);
    runpush(prVar4,(uint)(iVar3 != 0) * 3 + 5,&rStack_18);
  }
  return;
}

Assistant:

void biftrc(bifcxdef *ctx, int argc)
{
    runsdef val;
    int     n;
    int     flag;

    if (argc == 2)
    {
        /* get the type indicator and the on/off status */
        n = runpopnum(ctx->bifcxrun);
        flag = runpoplog(ctx->bifcxrun);

        /* see what type of debugging they want to turn on or off */
        switch(n)
        {
        case 1:
            /* turn on parser tracing */
            if (flag)
                ctx->bifcxrun->runcxvoc->voccxflg |= VOCCXFDBG;
            else
                ctx->bifcxrun->runcxvoc->voccxflg &= ~VOCCXFDBG;
            break;

        default:
            /* ignore other requests */
            runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "debugTrace");
        }
    }
    else
    {
        /* break into debugger; return whether debugger is present */
        bifcntargs(ctx, 0, argc);
        runpush(ctx->bifcxrun, runclog(dbgstart(ctx->bifcxrun->runcxdbg)),
                &val);
    }
}